

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O2

compressed_lower_distance_matrix *
read_point_cloud(compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  istream *piVar1;
  ostream *poVar2;
  int i;
  int j;
  int j_00;
  int iVar3;
  value_t local_21c;
  vector<float,_std::allocator<float>_> distances;
  value_t value;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  string line;
  euclidean_distance_matrix eucl_dist;
  
  points.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  points.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  points.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input_stream,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::istringstream::istringstream((istringstream *)&eucl_dist,(string *)&line,_S_in);
    while( true ) {
      piVar1 = std::istream::_M_extract<float>((float *)&eucl_dist);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &distances.super__Vector_base<float,_std::allocator<float>_>,&value);
      std::istream::ignore();
    }
    if (distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back(&points,(value_type *)&distances.super__Vector_base<float,_std::allocator<float>_>
                 );
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&eucl_dist);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&distances.super__Vector_base<float,_std::allocator<float>_>);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&eucl_dist.points,&points);
  poVar2 = std::operator<<((ostream *)&std::cout,"point cloud with ");
  iVar3 = (int)(((long)eucl_dist.points.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)eucl_dist.points.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  poVar2 = std::operator<<(poVar2," points in dimension ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  i = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; i != iVar3; i = i + 1) {
    for (j_00 = 0; i != j_00; j_00 = j_00 + 1) {
      local_21c = euclidean_distance_matrix::operator()(&eucl_dist,i,j_00);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(&distances,&local_21c);
    }
  }
  compressed_distance_matrix<(compressed_matrix_layout)0>::compressed_distance_matrix
            (__return_storage_ptr__,&distances);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&distances.super__Vector_base<float,_std::allocator<float>_>);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&eucl_dist.points);
  std::__cxx11::string::~string((string *)&line);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&points);
  return __return_storage_ptr__;
}

Assistant:

compressed_lower_distance_matrix read_point_cloud(std::istream& input_stream) {
	std::vector<std::vector<value_t>> points;

	std::string line;
	value_t value;
	while (std::getline(input_stream, line)) {
		std::vector<value_t> point;
		std::istringstream s(line);
		while (s >> value) {
			point.push_back(value);
			s.ignore();
		}
		if (!point.empty()) points.push_back(point);
		assert(point.size() == points.front().size());
	}

	euclidean_distance_matrix eucl_dist(std::move(points));

	index_t n = index_t(eucl_dist.size());

	std::cout << "point cloud with " << n << " points in dimension " << eucl_dist.points.front().size() << std::endl;

	std::vector<value_t> distances;

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < i; ++j) distances.push_back(eucl_dist(i, j));

	return compressed_lower_distance_matrix(std::move(distances));
}